

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestAbortInternal::Run(TestAbortInternal *this)

{
  Outputter *pOVar1;
  char (*in_RDX) [13];
  int local_60;
  undefined1 local_59 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_50;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_48;
  testinator local_30 [32];
  TestAbortInternal *local_10;
  TestAbortInternal *this_local;
  
  this->m_runCalled = true;
  pOVar1 = (this->super_Test).m_op;
  local_59[0] = 0;
  local_10 = this;
  local_50 = testinator::operator<<
                       ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_59,
                        (Cons<testinator::Nil> *)"Hello world ",in_RDX);
  local_60 = 0x2a;
  testinator::operator<<
            (&local_48,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_59 + 1),&local_60);
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (local_30,&local_48);
  (*pOVar1->_vptr_Outputter[5])(pOVar1,local_30);
  std::__cxx11::string::~string((string *)local_30);
  testinator::TestRegistry::Abort((this->super_Test).m_registry);
  return true;
}

Assistant:

virtual bool Run()
  {
    m_runCalled = true;
    ABORT("Hello world " << 42);
    return true;
  }